

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall icu_63::UVector32::sortedInsert(UVector32 *this,int32_t tok,UErrorCode *ec)

{
  int32_t *piVar1;
  UBool UVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = this->count;
  if (iVar4 == 0) {
    iVar7 = 0;
  }
  else {
    iVar6 = 0;
    iVar7 = iVar4;
    do {
      iVar5 = (iVar6 + iVar7) / 2;
      if (this->elements[iVar5] <= tok) {
        iVar6 = iVar5 + 1;
        iVar5 = iVar7;
      }
      iVar7 = iVar5;
    } while (iVar6 != iVar7);
  }
  if ((iVar4 < -1) || (this->capacity <= iVar4)) {
    UVar2 = expandCapacity(this,iVar4 + 1,ec);
    if (UVar2 == '\0') {
      return;
    }
    iVar4 = this->count;
  }
  piVar1 = this->elements;
  if (iVar7 < iVar4) {
    lVar3 = (long)iVar4;
    do {
      piVar1[lVar3] = piVar1[lVar3 + -1];
      lVar3 = lVar3 + -1;
    } while (iVar7 < lVar3);
  }
  piVar1[iVar7] = tok;
  this->count = this->count + 1;
  return;
}

Assistant:

void UVector32::sortedInsert(int32_t tok, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        //int8_t c = (*compare)(elements[probe], tok);
        //if (c > 0) {
        if (elements[probe] > tok) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = tok;
        ++count;
    }
}